

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  lzx_br *br;
  z_streamp strm;
  lzx_stream *strm_00;
  undefined1 *puVar1;
  undefined1 uVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  ushort uVar9;
  ushort uVar10;
  wchar_t wVar11;
  uint uVar12;
  wchar_t wVar13;
  uint uVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  int iVar17;
  void *pvVar18;
  void *pvVar19;
  ulong uVar20;
  int64_t iVar21;
  byte *pbVar22;
  void *pvVar23;
  undefined4 *puVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  byte bVar29;
  int iVar30;
  long lVar31;
  char *pcVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  int *piVar37;
  uint uVar38;
  void *pvVar39;
  undefined1 *__dest;
  wchar_t wVar40;
  size_t __n;
  char cVar41;
  undefined1 auVar42 [16];
  ssize_t bytes_avail;
  ssize_t bytes_avail_1;
  uint local_16c;
  uint local_15c;
  uint local_134;
  uint local_11c;
  lzx_br local_d8 [4];
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  int local_6c;
  long local_68;
  long local_60;
  long local_58;
  ulong *local_50;
  long local_48;
  long local_40;
  byte *local_38;
  
  pvVar18 = a->format->data;
  wVar11 = cab_next_cfdata(a);
  if (wVar11 < L'\0') {
    *avail = (long)wVar11;
    return (void *)0x0;
  }
  lVar27 = *(long *)((long)pvVar18 + 0x28);
  sVar3 = *(short *)(lVar27 + 6);
  if (sVar3 == 3) {
    pvVar18 = a->format->data;
    lVar27 = *(long *)((long)pvVar18 + 0x38);
    pvVar19 = *(void **)((long)pvVar18 + 0xa0);
    if (pvVar19 == (void *)0x0) {
      *(undefined8 *)((long)pvVar18 + 0xa8) = 0x8000;
      pvVar19 = malloc(0x8000);
      *(void **)((long)pvVar18 + 0xa0) = pvVar19;
      if (pvVar19 == (void *)0x0) {
LAB_003d164f:
        pcVar32 = "No memory for CAB reader";
        iVar17 = 0xc;
        goto LAB_003d1a92;
      }
    }
    uVar9 = *(ushort *)(lVar27 + 0xc);
    uVar20 = (ulong)uVar9;
    uVar10 = *(ushort *)(lVar27 + 8);
    if (uVar9 == uVar10) {
      uVar9 = *(ushort *)(lVar27 + 0xe);
      *avail = uVar20 - uVar9;
      return (void *)((long)pvVar19 + (ulong)uVar9);
    }
    local_80 = lVar27;
    if (*(char *)(*(long *)((long)pvVar18 + 0x28) + 0x5c) == '\0') {
      uVar10 = *(ushort *)(*(long *)((long)pvVar18 + 0x28) + 8);
      puVar24 = *(undefined4 **)((long)pvVar18 + 0x1b8);
      if (puVar24 == (undefined4 *)0x0) {
        puVar24 = (undefined4 *)calloc(1,0x220);
        *(undefined4 **)((long)pvVar18 + 0x1b8) = puVar24;
        if (puVar24 == (undefined4 *)0x0) goto LAB_003d1a18;
      }
      puVar24[0x87] = 0xffffffe7;
      if (uVar10 - 0x16 < 0xfffffff9) goto LAB_003d1a18;
      puVar24[0x87] = 0xffffffe2;
      iVar17 = puVar24[1];
      uVar38 = slots[uVar10 - 0xf];
      iVar30 = 1 << ((byte)uVar10 & 0x1f);
      puVar24[1] = iVar30;
      puVar24[2] = iVar30 + -1;
      if ((*(void **)(puVar24 + 4) == (void *)0x0) || (iVar17 != iVar30)) {
        free(*(void **)(puVar24 + 4));
        pvVar19 = malloc((long)(int)puVar24[1]);
        *(void **)(puVar24 + 4) = pvVar19;
        if (pvVar19 == (void *)0x0) goto LAB_003d1a18;
        free(*(void **)(puVar24 + 0x18));
        pvVar19 = malloc((long)(int)uVar38 * 8);
        *(void **)(puVar24 + 0x18) = pvVar19;
        if (pvVar19 == (void *)0x0) goto LAB_003d1a18;
        free(*(void **)(puVar24 + 100));
        free(*(void **)(puVar24 + 0x6a));
      }
      lVar27 = 0;
      auVar42 = _DAT_004c1a50;
      do {
        if (SUB164(auVar42 ^ _DAT_004c1a60,4) == -0x80000000 &&
            SUB164(auVar42 ^ _DAT_004c1a60,0) < -0x7fffffee) {
          *(int *)((long)&local_d8[0].cache_buffer + lVar27 * 4) = 1 << ((byte)lVar27 & 0x1f);
          *(int *)((long)&local_d8[0].cache_buffer + lVar27 * 4 + 4) = 2 << ((byte)lVar27 & 0x1f);
        }
        lVar27 = lVar27 + 2;
        lVar31 = auVar42._8_8_;
        auVar42._0_8_ = auVar42._0_8_ + 2;
        auVar42._8_8_ = lVar31 + 2;
      } while (lVar27 != 0x12);
      lVar27 = *(long *)(puVar24 + 0x18);
      uVar28 = 1;
      if (1 < (int)uVar38) {
        uVar28 = (ulong)uVar38;
      }
      uVar35 = 0;
      uVar36 = 0;
      uVar12 = 0;
      do {
        if (uVar36 == 0) {
          uVar12 = (uint)uVar35;
LAB_003d1949:
          uVar36 = 0xfffffffe;
          uVar4 = uVar12;
          if (uVar12 != 0) {
            do {
              uVar36 = uVar36 + 1;
              bVar7 = 1 < uVar4;
              uVar4 = (int)uVar4 >> 1;
            } while (bVar7);
          }
          if ((int)uVar36 < 1) {
            uVar36 = 0;
          }
        }
        else {
          uVar12 = uVar12 + *(int *)((long)&local_d8[0].cache_buffer + (ulong)uVar36 * 4);
          if (uVar36 < 0x11) goto LAB_003d1949;
        }
        *(uint *)(lVar27 + uVar35 * 8) = uVar12;
        *(uint *)(lVar27 + 4 + uVar35 * 8) = uVar36;
        uVar35 = uVar35 + 1;
      } while (uVar35 != uVar28);
      puVar24[6] = 0;
      *puVar24 = 0;
      *(undefined8 *)(puVar24 + 0x1a) = 0;
      puVar24[0x1c] = 0;
      puVar24[0x12] = 1;
      *(undefined8 *)(puVar24 + 0x10) = 0x100000001;
      wVar11 = lzx_huffman_init((huffman *)(puVar24 + 0x1e),8,L'\b');
      if ((((wVar11 != L'\0') ||
           (wVar11 = lzx_huffman_init((huffman *)(puVar24 + 0x6c),0x14,L'\n'), wVar11 != L'\0')) ||
          (wVar11 = lzx_huffman_init((huffman *)(puVar24 + 0x52),(long)(int)(uVar38 * 8 + 0x100),
                                     L'\x10'), wVar11 != L'\0')) ||
         (wVar11 = lzx_huffman_init((huffman *)(puVar24 + 0x38),0xf9,L'\x10'), wVar11 != L'\0')) {
LAB_003d1a18:
        archive_set_error(&a->archive,-1,"Can\'t initialize LZX decompression.");
        *avail = -0x1e;
        return (void *)0x0;
      }
      puVar24[0x87] = 0;
      *(undefined1 *)(*(long *)((long)pvVar18 + 0x28) + 0x5c) = 1;
      uVar10 = *(ushort *)(local_80 + 8);
    }
    lVar27 = *(long *)((long)pvVar18 + 0x1b8);
    *(undefined4 *)(lVar27 + 0x70) = 0;
    *(undefined1 *)(lVar27 + 0x75) = 0;
    *(ulong *)((long)pvVar18 + 0x1b0) = uVar20;
    lVar27 = local_80;
    if (uVar9 < uVar10) {
      strm_00 = (lzx_stream *)((long)pvVar18 + 0x188);
      uVar28 = (ulong)uVar10;
LAB_003d0332:
      *(ulong *)((long)pvVar18 + 0x1a0) = uVar20 + *(long *)((long)pvVar18 + 0xa0);
      *(ulong *)((long)pvVar18 + 0x1a8) = uVar28 - uVar20;
      pbVar22 = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_78);
      if (0 < (long)local_78) {
        uVar20 = (ulong)*(ushort *)(lVar27 + 6);
        if (uVar20 < local_78) {
          local_78 = uVar20;
        }
        uVar28 = local_78;
        *(byte **)((long)pvVar18 + 0x188) = pbVar22;
        *(ulong *)((long)pvVar18 + 400) = local_78;
        *(undefined8 *)((long)pvVar18 + 0x198) = 0;
        piVar37 = *(int **)((long)pvVar18 + 0x1b8);
        uVar38 = piVar37[0x87];
        if (uVar38 == 0) {
          if (((local_78 != 0) && (*(char *)((long)piVar37 + 0x75) != '\0')) &&
             (iVar17 = piVar37[0x1c], iVar17 + -0x41 < -0x10)) {
            *(ulong *)(piVar37 + 0x1a) =
                 (ulong)*(byte *)(piVar37 + 0x1d) |
                 (ulong)*pbVar22 << 8 | *(long *)(piVar37 + 0x1a) << 0x10;
            *(byte **)((long)pvVar18 + 0x188) = pbVar22 + 1;
            *(ulong *)((long)pvVar18 + 400) = local_78 - 1;
            piVar37[0x1c] = iVar17 + 0x10;
            *(undefined1 *)((long)piVar37 + 0x75) = 0;
          }
          iVar17 = *piVar37;
          local_38 = pbVar22;
          if (iVar17 < 0x12) {
LAB_003d0442:
            piVar6 = *(int **)((long)pvVar18 + 0x1b8);
            br = (lzx_br *)(piVar6 + 0x1a);
            iVar17 = *piVar6;
switchD_003d0465_default:
            switch(iVar17) {
            case 0:
              iVar17 = piVar6[0x1c];
              if (iVar17 < 1) {
                wVar11 = lzx_br_fillup(strm_00,br);
                iVar17 = piVar6[0x1c];
                if (iVar17 < 1 && wVar11 == L'\0') {
                  *piVar6 = 0;
                  goto LAB_003d1533;
                }
              }
              uVar38 = iVar17 - 1;
              cVar41 = (*(ulong *)(piVar6 + 0x1a) >> ((ulong)uVar38 & 0x3f) & 1) != 0;
              *(char *)(piVar6 + 10) = cVar41;
              piVar6[0x1c] = uVar38;
              break;
            case 1:
              cVar41 = (char)piVar6[10];
              uVar38 = piVar6[0x1c];
              break;
            case 2:
              uVar38 = piVar6[0x1c];
              goto LAB_003d0500;
            case 3:
              iVar17 = piVar6[0x1c];
              goto LAB_003d054c;
            case 4:
              uVar38 = piVar6[0x1c];
              goto LAB_003d1175;
            case 5:
            case 6:
            case 7:
              goto switchD_003d0465_caseD_5;
            case 8:
              goto switchD_003d0465_caseD_8;
            case 9:
              goto switchD_003d0465_caseD_9;
            case 10:
              goto switchD_003d0465_caseD_a;
            case 0xb:
              goto switchD_003d0465_caseD_b;
            case 0xc:
              goto switchD_003d0465_caseD_c;
            case 0xd:
              goto switchD_003d0465_caseD_d;
            case 0xe:
              goto switchD_003d0465_caseD_e;
            case 0xf:
              goto switchD_003d0465_caseD_f;
            case 0x10:
              goto switchD_003d0465_caseD_10;
            case 0x11:
              goto switchD_003d0465_caseD_11;
            default:
              goto switchD_003d0465_default;
            }
            if (cVar41 != '\0') {
              if ((int)uVar38 < 0x20) {
                wVar11 = lzx_br_fillup(strm_00,br);
                uVar38 = piVar6[0x1c];
                if ((int)uVar38 < 0x20 && wVar11 == L'\0') {
                  *piVar6 = 1;
                  goto LAB_003d1533;
                }
              }
              cVar41 = (char)uVar38;
              uVar38 = uVar38 - 0x20;
              piVar6[9] = (uint)(*(ulong *)(piVar6 + 0x1a) >> ((byte)uVar38 & 0x3f)) & 0xffff |
                          (int)(*(ulong *)(piVar6 + 0x1a) >> (cVar41 - 0x10U & 0x3f)) << 0x10;
              piVar6[0x1c] = uVar38;
            }
LAB_003d0500:
            if ((int)uVar38 < 3) {
              wVar11 = lzx_br_fillup(strm_00,br);
              uVar38 = piVar6[0x1c];
              if ((int)uVar38 < 3 && wVar11 == L'\0') {
                *piVar6 = 2;
                goto LAB_003d1533;
              }
            }
            iVar17 = uVar38 - 3;
            bVar29 = (byte)(*(ulong *)(piVar6 + 0x1a) >> ((byte)iVar17 & 0x3f)) & 7;
            *(byte *)((long)piVar6 + 0x29) = bVar29;
            piVar6[0x1c] = iVar17;
            if (2 < (byte)(bVar29 - 1)) goto LAB_003d153f;
LAB_003d054c:
            if (iVar17 < 0x18) {
              wVar11 = lzx_br_fillup(strm_00,br);
              iVar17 = piVar6[0x1c];
              if (iVar17 < 0x18 && wVar11 == L'\0') {
                *piVar6 = 3;
                goto LAB_003d1533;
              }
            }
            uVar38 = iVar17 - 0x18;
            uVar35 = *(ulong *)(piVar6 + 0x1a) >> ((byte)uVar38 & 0x3f) & 0xffff |
                     (ulong)(((uint)(*(ulong *)(piVar6 + 0x1a) >> ((char)iVar17 - 8U & 0x3f)) & 0xff
                             ) << 0x10);
            *(ulong *)(piVar6 + 0xc) = uVar35;
            piVar6[0x1c] = uVar38;
            if (uVar35 == 0) goto LAB_003d153f;
            *(ulong *)(piVar6 + 0xe) = uVar35;
            iVar17 = 0xb;
            if (*(char *)((long)piVar6 + 0x29) != '\x01') {
              if (*(char *)((long)piVar6 + 0x29) == '\x03') {
LAB_003d1175:
                if ((uVar38 & 0xf) == 0) {
                  if ((int)uVar38 < 0x10) {
                    wVar11 = lzx_br_fillup(strm_00,br);
                    uVar38 = piVar6[0x1c];
                    if ((int)uVar38 < 0x10 && wVar11 == L'\0') {
                      *piVar6 = 4;
                      goto LAB_003d1533;
                    }
                  }
                  uVar38 = uVar38 - 0x10;
                }
                else {
                  uVar38 = uVar38 & 0xfffffff0;
                }
                piVar6[0x1c] = uVar38;
                piVar6[0x14] = 0;
                *piVar6 = 5;
                goto switchD_003d0465_caseD_5;
              }
              iVar17 = 10;
            }
            *piVar6 = iVar17;
            goto switchD_003d0465_default;
          }
          goto LAB_003d07ea;
        }
        iVar21 = 0;
        goto LAB_003d15f3;
      }
      pcVar32 = "Truncated CAB file data";
      goto LAB_003d1ba8;
    }
LAB_003d1666:
    if ((ulong)*(ushort *)(lVar27 + 6) != 0) {
      pvVar19 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar27 + 6),(ssize_t *)local_d8);
      if ((long)local_d8[0].cache_buffer < 1) {
        pcVar32 = "Truncated CAB header";
LAB_003d1ba8:
        archive_set_error(&a->archive,0x54,pcVar32);
      }
      else {
        *(ulong *)(lVar27 + 0x10) = (ulong)*(ushort *)(lVar27 + 6);
        *(void **)(lVar27 + 0x38) = pvVar19;
        iVar21 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar27 + 6));
        if (-1 < iVar21) {
          uVar10 = *(ushort *)(lVar27 + 8);
          goto LAB_003d16ad;
        }
      }
LAB_003d1bcf:
      *avail = -0x1e;
      return (void *)0x0;
    }
LAB_003d16ad:
    pvVar19 = *(void **)((long)pvVar18 + 0xa0);
    if ((10 < uVar10) &&
       (lVar31 = *(long *)((long)pvVar18 + 0x1b8), *(char *)(lVar31 + 0x28) != '\0')) {
      iVar17 = *(int *)(*(long *)((long)pvVar18 + 0x28) + 0x58);
      pvVar39 = (void *)((long)pvVar19 + ((ulong)uVar10 - 10));
      pvVar23 = pvVar19;
      do {
        pvVar23 = memchr(pvVar23,0xe8,(long)pvVar39 - (long)pvVar23);
        if (pvVar23 == (void *)0x0) break;
        iVar26 = ((int)pvVar19 - (int)pvVar23) + iVar17 * -0x8000 + 0x8000;
        iVar30 = *(int *)((long)pvVar23 + 1);
        if ((iVar26 <= iVar30) && (iVar5 = *(int *)(lVar31 + 0x24), iVar30 < iVar5)) {
          if (iVar30 < 0) {
            iVar26 = iVar5;
          }
          *(int *)((long)pvVar23 + 1) = iVar26 + iVar30;
        }
        pvVar23 = (void *)((long)pvVar23 + 5);
      } while (pvVar23 < pvVar39);
      pvVar19 = *(void **)((long)pvVar18 + 0xa0);
      lVar27 = local_80;
    }
    uVar9 = *(ushort *)(lVar27 + 0xe);
    *avail = (uVar20 & 0xffff) - (ulong)uVar9;
    *(short *)(lVar27 + 0xc) = (short)uVar20;
    return (void *)((long)pvVar19 + (ulong)uVar9);
  }
  if (sVar3 != 1) {
    if (sVar3 != 0) {
      archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                        *(undefined8 *)(lVar27 + 0x10));
      *avail = -0x19;
      return (void *)0x0;
    }
    lVar27 = *(long *)((long)a->format->data + 0x38);
    pvVar18 = __archive_read_ahead(a,1,avail);
    uVar20 = *avail;
    if (0 < (long)uVar20) {
      uVar28 = (ulong)*(ushort *)(lVar27 + 10);
      if (uVar28 < uVar20) {
        *avail = uVar28;
        uVar20 = uVar28;
      }
      *(undefined2 *)(lVar27 + 0xc) = *(undefined2 *)(lVar27 + 8);
      *(ulong *)(lVar27 + 0x10) = uVar20;
      *(void **)(lVar27 + 0x38) = pvVar18;
      return pvVar18;
    }
    pcVar32 = "Truncated CAB header";
    iVar17 = 0x54;
    goto LAB_003d1a92;
  }
  pvVar18 = a->format->data;
  lVar27 = *(long *)((long)pvVar18 + 0x38);
  pvVar19 = *(void **)((long)pvVar18 + 0xa0);
  if (pvVar19 == (void *)0x0) {
    *(undefined8 *)((long)pvVar18 + 0xa8) = 0x8000;
    pvVar19 = malloc(0x8000);
    *(void **)((long)pvVar18 + 0xa0) = pvVar19;
    if (pvVar19 == (void *)0x0) goto LAB_003d164f;
  }
  uVar9 = *(ushort *)(lVar27 + 0xc);
  if (uVar9 == *(ushort *)(lVar27 + 8)) {
    uVar10 = *(ushort *)(lVar27 + 0xe);
    *avail = (ulong)uVar9 - (ulong)uVar10;
    return (void *)((long)pvVar19 + (ulong)uVar10);
  }
  if (*(char *)(*(long *)((long)pvVar18 + 0x28) + 0x5c) == '\0') {
    *(undefined8 *)((long)pvVar18 + 0x110) = 0;
    *(undefined4 *)((long)pvVar18 + 0x118) = 0;
    *(undefined8 *)((long)pvVar18 + 0x138) = 0;
    *(undefined1 (*) [16])((long)pvVar18 + 0x120) = (undefined1  [16])0x0;
    *(undefined4 *)((long)pvVar18 + 0x130) = 0;
    if (*(char *)((long)pvVar18 + 0x180) == '\0') {
      iVar17 = cm_zlib_inflateInit2_((z_streamp)((long)pvVar18 + 0x110),-0xf,"1.2.3",0x70);
    }
    else {
      iVar17 = cm_zlib_inflateReset((z_streamp)((long)pvVar18 + 0x110));
    }
    if (iVar17 != 0) {
      pcVar32 = "Can\'t initialize deflate decompression.";
      iVar17 = -1;
LAB_003d1a92:
      archive_set_error(&a->archive,iVar17,pcVar32);
      *avail = -0x1e;
      return (void *)0x0;
    }
    *(undefined1 *)((long)pvVar18 + 0x180) = 1;
    *(undefined1 *)(*(long *)((long)pvVar18 + 0x28) + 0x5c) = 1;
  }
  uVar38 = (uint)(*(short *)(lVar27 + 6) == *(short *)(lVar27 + 4)) * 2;
  strm = (z_streamp)((long)pvVar18 + 0x110);
  *(ulong *)((long)pvVar18 + 0x138) = (ulong)uVar9;
  do {
    uVar20 = *(ulong *)((long)pvVar18 + 0x138);
    uVar9 = *(ushort *)(lVar27 + 8);
    if (uVar9 <= uVar20) goto LAB_003d02a1;
    *(ulong *)((long)pvVar18 + 0x128) = *(long *)((long)pvVar18 + 0xa0) + uVar20;
    *(uint *)((long)pvVar18 + 0x130) = (uint)uVar9 - (int)uVar20;
    pcVar32 = (char *)__archive_read_ahead(a,1,(ssize_t *)local_d8);
    if ((long)local_d8[0].cache_buffer < 1) goto LAB_003d1ad4;
    if (*(ushort *)(lVar27 + 6) < local_d8[0].cache_buffer) {
      local_d8[0].cache_buffer = (ulong)*(ushort *)(lVar27 + 6);
    }
    *(char **)((long)pvVar18 + 0x110) = pcVar32;
    *(int *)((long)pvVar18 + 0x118) = (int)local_d8[0].cache_buffer;
    *(undefined8 *)((long)pvVar18 + 0x120) = 0;
    if (0 < (int)uVar38) {
      if (local_d8[0].cache_buffer != 0) {
        uVar20 = (ulong)uVar38;
        if (local_d8[0].cache_buffer <= uVar20) {
          cVar41 = *pcVar32;
          if (uVar38 == 2) {
            if (cVar41 != 'C') goto LAB_003d1a3a;
            if (local_d8[0].cache_buffer != 1) {
              cVar41 = pcVar32[1];
              goto joined_r0x003d0263;
            }
          }
          else {
joined_r0x003d0263:
            if (cVar41 != 'K') goto LAB_003d1a3a;
          }
          *(uint64_t *)(lVar27 + 0x10) = local_d8[0].cache_buffer;
          *(char **)(lVar27 + 0x38) = pcVar32;
          iVar21 = cab_minimum_consume_cfdata(a,local_d8[0].cache_buffer);
          if (-1 < iVar21) {
            uVar38 = uVar38 - (int)local_d8[0].cache_buffer;
            bVar7 = false;
            goto LAB_003d028d;
          }
          goto LAB_003d1ae0;
        }
        if (((uVar38 != 1) && (*pcVar32 == 'C')) && (pcVar32[1] == 'K')) {
          *(char **)((long)pvVar18 + 0x110) = pcVar32 + uVar20;
          *(uint *)((long)pvVar18 + 0x118) = (int)local_d8[0].cache_buffer - uVar38;
          *(ulong *)((long)pvVar18 + 0x120) = uVar20;
          uVar38 = 0;
          goto LAB_003d01fd;
        }
      }
LAB_003d1a3a:
      archive_set_error(&a->archive,-1,"CFDATA incorrect(no MSZIP signature)");
      goto LAB_003d1a53;
    }
LAB_003d01fd:
    bVar7 = false;
    uVar12 = cm_zlib_inflate(strm,0);
    if (uVar12 != 0) {
      if (uVar12 != 1) goto LAB_003d1b71;
      bVar7 = true;
    }
    iVar21 = *(int64_t *)((long)pvVar18 + 0x120);
    *(int64_t *)(lVar27 + 0x10) = iVar21;
    *(char **)(lVar27 + 0x38) = pcVar32;
    iVar21 = cab_minimum_consume_cfdata(a,iVar21);
    if (iVar21 < 0) goto LAB_003d1ae0;
LAB_003d028d:
  } while (!bVar7);
  uVar20 = *(ulong *)((long)pvVar18 + 0x138);
  uVar9 = *(ushort *)(lVar27 + 8);
LAB_003d02a1:
  uVar28 = uVar20 & 0xffff;
  if ((uint)uVar28 < (uint)uVar9) {
    archive_set_error(&a->archive,-1,"Invalid uncompressed size (%d < %d)",uVar28);
LAB_003d1a53:
    *avail = -0x1e;
    return (void *)0x0;
  }
  if ((ulong)*(ushort *)(lVar27 + 6) == 0) {
LAB_003d1b3d:
    if (((int)(uint)*(ushort *)(*(long *)((long)pvVar18 + 0x28) + 4) <=
         *(int *)(*(long *)((long)pvVar18 + 0x28) + 0x58)) ||
       ((uVar12 = cm_zlib_inflateReset(strm), uVar12 == 0 &&
        (uVar12 = cm_zlib_inflateSetDictionary
                            (strm,*(Bytef **)((long)pvVar18 + 0xa0),(uint)*(ushort *)(lVar27 + 8)),
        uVar12 == 0)))) {
      uVar9 = *(ushort *)(lVar27 + 0xe);
      lVar31 = *(long *)((long)pvVar18 + 0xa0);
      *avail = uVar28 - uVar9;
      *(short *)(lVar27 + 0xc) = (short)uVar20;
      return (void *)((ulong)uVar9 + lVar31);
    }
LAB_003d1b71:
    if (uVar12 == 0xfffffffc) {
      archive_set_error(&a->archive,0xc,"Out of memory for deflate decompression");
    }
    else {
      archive_set_error(&a->archive,-1,"Deflate decompression failed (%d)",(ulong)uVar12);
    }
    *avail = -0x1e;
  }
  else {
    pvVar19 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar27 + 6),(ssize_t *)local_d8);
    if ((long)local_d8[0].cache_buffer < 1) {
LAB_003d1ad4:
      archive_set_error(&a->archive,0x54,"Truncated CAB header");
    }
    else {
      *(ulong *)(lVar27 + 0x10) = (ulong)*(ushort *)(lVar27 + 6);
      *(void **)(lVar27 + 0x38) = pvVar19;
      iVar21 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar27 + 6));
      if (-1 < iVar21) goto LAB_003d1b3d;
    }
LAB_003d1ae0:
    *avail = -0x1e;
  }
  return (void *)0x0;
switchD_003d0465_caseD_a:
  wVar11 = piVar6[0x1e];
  if (piVar6[0x1c] < wVar11 * 3) {
    wVar13 = lzx_br_fillup(strm_00,br);
    wVar11 = ((huffman *)(piVar6 + 0x1e))->len_size;
    if ((wVar13 == L'\0') && (piVar6[0x1c] < wVar11 * 3)) {
      *piVar6 = 10;
      goto LAB_003d1533;
    }
  }
  *(undefined1 (*) [16])(piVar6 + 0x2b) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(piVar6 + 0x27) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(piVar6 + 0x23) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(piVar6 + 0x1f) = (undefined1  [16])0x0;
  piVar6[0x2f] = 0;
  if (L'\0' < wVar11) {
    iVar17 = piVar6[0x1c];
    lVar27 = *(long *)(piVar6 + 0x30);
    lVar31 = 0;
    do {
      *(byte *)(lVar27 + lVar31) =
           (byte)(*(ulong *)(piVar6 + 0x1a) >> ((char)iVar17 - 3U & 0x3f)) & 7;
      lVar27 = *(long *)(piVar6 + 0x30);
      piVar6[(ulong)*(byte *)(lVar27 + lVar31) + 0x1f] =
           piVar6[(ulong)*(byte *)(lVar27 + lVar31) + 0x1f] + 1;
      iVar17 = piVar6[0x1c] + -3;
      piVar6[0x1c] = iVar17;
      lVar31 = lVar31 + 1;
    } while (lVar31 < piVar6[0x1e]);
  }
  wVar11 = lzx_make_huffman_table((huffman *)(piVar6 + 0x1e));
  if (wVar11 == L'\0') goto LAB_003d153f;
switchD_003d0465_caseD_b:
  piVar6[0x86] = 0;
switchD_003d0465_caseD_c:
  wVar11 = lzx_read_pre_tree(strm_00);
  if (wVar11 == L'\0') {
    *piVar6 = 0xc;
    goto LAB_003d1533;
  }
  wVar11 = lzx_make_huffman_table((huffman *)(piVar6 + 0x6c));
  if (wVar11 == L'\0') goto LAB_003d153f;
  piVar6[0x86] = 0;
switchD_003d0465_caseD_d:
  wVar11 = lzx_read_bitlen(strm_00,(huffman *)(piVar6 + 0x52),L'Ā');
  if (wVar11 < L'\0') goto LAB_003d153f;
  if (wVar11 == L'\0') {
    *piVar6 = 0xd;
    goto LAB_003d1533;
  }
  piVar6[0x86] = 0;
switchD_003d0465_caseD_e:
  wVar11 = lzx_read_pre_tree(strm_00);
  if (wVar11 == L'\0') {
    *piVar6 = 0xe;
    goto LAB_003d1533;
  }
  wVar11 = lzx_make_huffman_table((huffman *)(piVar6 + 0x6c));
  if (wVar11 == L'\0') goto LAB_003d153f;
  piVar6[0x86] = 0x100;
switchD_003d0465_caseD_f:
  wVar11 = lzx_read_bitlen(strm_00,(huffman *)(piVar6 + 0x52),L'\xffffffff');
  if (wVar11 < L'\0') goto LAB_003d153f;
  if (wVar11 == L'\0') {
    *piVar6 = 0xf;
    goto LAB_003d1533;
  }
  wVar11 = lzx_make_huffman_table((huffman *)(piVar6 + 0x52));
  if (wVar11 == L'\0') goto LAB_003d153f;
  piVar6[0x86] = 0;
switchD_003d0465_caseD_10:
  wVar11 = lzx_read_pre_tree(strm_00);
  if (wVar11 == L'\0') {
    *piVar6 = 0x10;
    goto LAB_003d1533;
  }
  wVar11 = lzx_make_huffman_table((huffman *)(piVar6 + 0x6c));
  if (wVar11 == L'\0') goto LAB_003d153f;
  piVar6[0x86] = 0;
switchD_003d0465_caseD_11:
  wVar11 = lzx_read_bitlen(strm_00,(huffman *)(piVar6 + 0x38),L'\xffffffff');
  if (wVar11 < L'\0') goto LAB_003d153f;
  if (wVar11 == L'\0') {
    *piVar6 = 0x11;
    goto LAB_003d1533;
  }
  wVar11 = lzx_make_huffman_table((huffman *)(piVar6 + 0x38));
  if (wVar11 == L'\0') goto LAB_003d153f;
  *piVar6 = 0x12;
  if (0x11 < *piVar37) goto code_r0x003d07db;
  goto LAB_003d0442;
code_r0x003d07db:
  piVar37 = *(int **)((long)pvVar18 + 0x1b8);
  iVar17 = *piVar37;
LAB_003d07ea:
  local_40 = *(long *)((long)pvVar18 + 0x1a8);
  local_50 = (ulong *)(piVar37 + 0x1a);
  local_d8[0].cache_buffer = *(uint64_t *)(piVar37 + 0x1a);
  local_d8[0]._8_8_ = *(undefined8 *)(piVar37 + 0x1c);
  local_60 = *(long *)(piVar37 + 0x18);
  __dest = *(undefined1 **)((long)pvVar18 + 0x1a0);
  puVar1 = __dest + local_40;
  lVar27 = *(long *)(piVar37 + 4);
  local_68 = *(long *)(piVar37 + 0x30);
  local_58 = *(long *)(piVar37 + 0x4a);
  local_48 = *(long *)(piVar37 + 100);
  uVar35 = *(ulong *)(piVar37 + 0xe);
  local_90 = (long)piVar37[0x32];
  local_88 = (long)piVar37[0x4c];
  wVar11 = piVar37[0x66];
  uVar12 = piVar37[8];
  cVar41 = *(char *)((long)piVar37 + 0x29);
  uVar36 = piVar37[6];
  local_6c = piVar37[1];
  uVar4 = piVar37[2];
  uVar14 = piVar37[0x15];
  wVar13 = piVar37[0x17];
  local_15c = piVar37[0x16];
  local_16c = piVar37[0x10];
  uVar38 = piVar37[7];
  uVar25 = piVar37[0x12];
  uVar8 = piVar37[0x11];
switchD_003d092a_default:
  do {
    local_134 = uVar8;
    local_11c = uVar25;
    uVar34 = uVar38;
    iVar30 = iVar17;
    iVar17 = iVar30;
    uVar38 = uVar34;
    uVar25 = local_11c;
    uVar8 = local_134;
    switch(iVar30) {
    case 0x12:
      if (uVar35 != 0) {
        do {
          if (puVar1 <= __dest) {
            iVar17 = 0x12;
            goto LAB_003d1199;
          }
          if (local_d8[0].cache_avail < wVar11) {
            wVar40 = lzx_br_fillup(strm_00,local_d8);
            if ((wVar40 != L'\0') || (wVar11 <= local_d8[0].cache_avail)) goto LAB_003d0a18;
            if (uVar28 != uVar20) {
              iVar17 = 0x12;
              goto LAB_003d1199;
            }
            uVar9 = *(ushort *)
                     (*(long *)(piVar37 + 0x6a) +
                     (ulong)((uint)(local_d8[0].cache_buffer <<
                                   ((char)wVar11 - (char)local_d8[0]._8_8_ & 0x3fU)) &
                            cache_masks[wVar11]) * 2);
            uVar33 = (ulong)uVar9;
            if (piVar37[0x52] <= (int)(uint)uVar9) {
              uVar33 = 0;
            }
            iVar17 = local_d8[0].cache_avail - (uint)*(byte *)(local_48 + uVar33);
            local_d8[0].cache_avail = iVar17;
            if (iVar17 < 0) goto LAB_003d1584;
          }
          else {
LAB_003d0a18:
            uVar9 = *(ushort *)
                     (*(long *)(piVar37 + 0x6a) +
                     (ulong)((uint)(local_d8[0].cache_buffer >>
                                   ((char)local_d8[0].cache_avail - (char)wVar11 & 0x3fU)) &
                            cache_masks[wVar11]) * 2);
            uVar33 = (ulong)uVar9;
            if (piVar37[0x52] <= (int)(uint)uVar9) {
              uVar33 = 0;
            }
            local_d8[0].cache_avail = local_d8[0].cache_avail - (uint)*(byte *)(local_48 + uVar33);
          }
          uVar38 = (uint)uVar33;
          if (0xff < uVar38) goto LAB_003d0a91;
          *(char *)(lVar27 + (int)uVar36) = (char)uVar33;
          uVar36 = uVar36 + 1 & uVar4;
          *__dest = (char)uVar33;
          __dest = __dest + 1;
          uVar35 = uVar35 - 1;
          if (uVar35 == 0) break;
        } while( true );
      }
      *piVar37 = 2;
      *local_50 = local_d8[0].cache_buffer;
      local_50[1] = local_d8[0]._8_8_;
      piVar37[0xe] = 0;
      piVar37[0xf] = 0;
      piVar37[8] = uVar12;
      piVar37[7] = uVar34;
      piVar37[0x15] = uVar14;
      piVar37[0x16] = local_15c;
      piVar37[0x10] = local_16c;
      piVar37[0x11] = local_134;
      piVar37[0x12] = local_11c;
      piVar37[6] = uVar36;
      *(long *)((long)pvVar18 + 0x1a8) = (long)puVar1 - (long)__dest;
      uVar38 = 1;
      goto LAB_003d1599;
    case 0x13:
      goto LAB_003d0aa1;
    case 0x14:
      goto LAB_003d0c7d;
    case 0x15:
      uVar38 = local_16c;
      goto LAB_003d0f6a;
    case 0x16:
      goto LAB_003d0f8e;
    }
  } while( true );
  while (iVar17 != 8) {
switchD_003d0465_caseD_5:
    iVar17 = piVar6[0x1c];
    if (iVar17 < 0x20) {
      if (iVar17 < 0x10) {
        iVar17 = piVar6[0x14];
        if (3 < iVar17) goto LAB_003d1330;
      }
      else {
        uVar35 = *(ulong *)(piVar6 + 0x1a) >> ((byte)(iVar17 + -0x10) & 0x3f);
        piVar6[0x1c] = iVar17 + -0x10;
        *(char *)(piVar6 + 0x13) = (char)uVar35;
        *(char *)((long)piVar6 + 0x4d) = (char)(uVar35 >> 8);
        piVar6[0x14] = 2;
        iVar17 = 2;
      }
      if (*(char *)((long)piVar6 + 0x75) != '\0') {
        piVar6[0x14] = iVar17 + 1;
        *(char *)((long)piVar6 + (long)iVar17 + 0x4c) = (char)piVar6[0x1d];
        *(undefined1 *)((long)piVar6 + 0x75) = 0;
        iVar17 = piVar6[0x14];
        if (3 < iVar17) goto LAB_003d1330;
      }
      lVar27 = *(long *)((long)pvVar18 + 400);
      do {
        if (lVar27 < 1) goto LAB_003d1533;
        puVar1 = *(undefined1 **)((long)pvVar18 + 0x188);
        *(undefined1 **)((long)pvVar18 + 0x188) = puVar1 + 1;
        uVar2 = *puVar1;
        piVar6[0x14] = iVar17 + 1;
        *(undefined1 *)((long)piVar6 + (long)iVar17 + 0x4c) = uVar2;
        lVar27 = *(long *)((long)pvVar18 + 400) + -1;
        *(long *)((long)pvVar18 + 400) = lVar27;
        iVar17 = piVar6[0x14];
      } while (iVar17 < 4);
    }
    else {
      uVar35 = *(ulong *)(piVar6 + 0x1a) >> ((char)iVar17 - 0x10U & 0x3f);
      *(char *)(piVar6 + 0x13) = (char)uVar35;
      uVar33 = *(ulong *)(piVar6 + 0x1a) >> ((byte)(iVar17 + -0x20) & 0x3f);
      *(char *)((long)piVar6 + 0x4d) = (char)(uVar35 >> 8);
      piVar6[0x1c] = iVar17 + -0x20;
      *(char *)((long)piVar6 + 0x4e) = (char)uVar33;
      *(char *)((long)piVar6 + 0x4f) = (char)(uVar33 >> 8);
    }
LAB_003d1330:
    piVar6[0x14] = 0;
    iVar17 = *piVar6;
    if (iVar17 == 5) {
      iVar30 = piVar6[0x13];
      piVar6[0x10] = iVar30;
      iVar17 = 6;
LAB_003d1366:
      if (iVar30 < 0) goto LAB_003d153f;
      *piVar6 = iVar17;
    }
    else {
      if (iVar17 == 6) {
        iVar30 = piVar6[0x13];
        piVar6[0x11] = iVar30;
        iVar17 = 7;
        goto LAB_003d1366;
      }
      if (iVar17 == 7) {
        piVar6[0x12] = piVar6[0x13];
        if (piVar6[0x13] < 0) goto LAB_003d153f;
        *piVar6 = 8;
        break;
      }
    }
  }
switchD_003d0465_caseD_8:
  lVar27 = *(long *)(piVar6 + 0xe);
  if (lVar27 != 0) {
    lVar31 = *(long *)((long)pvVar18 + 0x1a8);
    do {
      uVar38 = 0;
      if (lVar31 < 1) goto LAB_003d15c1;
      uVar35 = *(ulong *)((long)pvVar18 + 400);
      if ((long)uVar35 < 1) {
        if (uVar28 == uVar20) goto LAB_003d153f;
        goto LAB_003d15c1;
      }
      uVar38 = piVar6[1] - piVar6[6];
      if ((int)(uint)lVar27 <= piVar6[1] - piVar6[6]) {
        uVar38 = (uint)lVar27;
      }
      if (lVar31 < (int)uVar38) {
        uVar38 = (uint)lVar31;
      }
      if ((long)(int)uVar38 <= (long)uVar35) {
        uVar35 = (ulong)uVar38;
      }
      __n = (size_t)(int)uVar35;
      memcpy(*(void **)((long)pvVar18 + 0x1a0),*(void **)((long)pvVar18 + 0x188),__n);
      memcpy((void *)((long)piVar6[6] + *(long *)(piVar6 + 4)),*(void **)((long)pvVar18 + 0x188),__n
            );
      *(long *)((long)pvVar18 + 0x188) = *(long *)((long)pvVar18 + 0x188) + __n;
      *(long *)((long)pvVar18 + 400) = *(long *)((long)pvVar18 + 400) - __n;
      *(long *)((long)pvVar18 + 0x1a0) = *(long *)((long)pvVar18 + 0x1a0) + __n;
      lVar31 = *(long *)((long)pvVar18 + 0x1a8) - __n;
      *(long *)((long)pvVar18 + 0x1a8) = lVar31;
      *(long *)((long)pvVar18 + 0x1b0) = *(long *)((long)pvVar18 + 0x1b0) + __n;
      piVar6[6] = piVar6[6] + (int)uVar35 & piVar6[2];
      lVar27 = *(long *)(piVar6 + 0xe) - __n;
      *(long *)(piVar6 + 0xe) = lVar27;
    } while (lVar27 != 0);
  }
switchD_003d0465_caseD_9:
  if ((*(byte *)(piVar6 + 0xc) & 1) != 0) {
    if (*(long *)((long)pvVar18 + 400) < 1) {
      *piVar6 = 9;
LAB_003d1533:
      if (uVar28 == uVar20) {
LAB_003d153f:
        piVar6[0x87] = -0x19;
        uVar38 = 0xffffffe7;
      }
      else {
        uVar38 = 0;
      }
      goto LAB_003d15c1;
    }
    *(long *)((long)pvVar18 + 0x188) = *(long *)((long)pvVar18 + 0x188) + 1;
    *(long *)((long)pvVar18 + 400) = *(long *)((long)pvVar18 + 400) + -1;
  }
  *piVar6 = 2;
  uVar38 = 1;
  goto LAB_003d15c1;
LAB_003d0a91:
  uVar14 = uVar38 & 7;
  local_15c = uVar38 - 0x100 >> 3;
LAB_003d0aa1:
  if (uVar14 == 7) {
    if (local_d8[0].cache_avail < (wchar_t)local_88) {
      wVar40 = lzx_br_fillup(strm_00,local_d8);
      if ((wVar40 != L'\0') || ((wchar_t)local_88 <= local_d8[0].cache_avail)) goto LAB_003d0bb2;
      if (uVar28 != uVar20) {
        iVar17 = 0x13;
        uVar14 = 7;
        goto LAB_003d1199;
      }
      uVar9 = *(ushort *)
               (*(long *)(piVar37 + 0x50) +
               (ulong)((uint)(local_d8[0].cache_buffer <<
                             ((char)local_88 - (char)local_d8[0]._8_8_ & 0x3fU)) &
                      cache_masks[local_88]) * 2);
      uVar33 = (ulong)uVar9;
      if (piVar37[0x38] <= (int)(uint)uVar9) {
        uVar33 = 0;
      }
      iVar17 = (int)uVar33;
      iVar26 = local_d8[0].cache_avail - (uint)*(byte *)(local_58 + uVar33);
      local_d8[0].cache_avail = iVar26;
      if (iVar26 < 0) goto LAB_003d1584;
    }
    else {
LAB_003d0bb2:
      uVar9 = *(ushort *)
               (*(long *)(piVar37 + 0x50) +
               (ulong)((uint)(local_d8[0].cache_buffer >>
                             ((char)local_d8[0].cache_avail - (char)local_88 & 0x3fU)) &
                      cache_masks[local_88]) * 2);
      uVar33 = (ulong)uVar9;
      if (piVar37[0x38] <= (int)(uint)uVar9) {
        uVar33 = 0;
      }
      iVar17 = (int)uVar33;
      local_d8[0].cache_avail = local_d8[0].cache_avail - (uint)*(byte *)(local_58 + uVar33);
    }
    uVar12 = iVar17 + 9;
  }
  else {
    uVar12 = uVar14 + 2;
  }
  if (uVar35 < (ulong)(long)(int)uVar12) goto LAB_003d1584;
  iVar17 = 0x15;
  uVar38 = local_16c;
  if (local_15c == 0) goto switchD_003d092a_default;
  if (local_15c == 2) {
    local_15c = 2;
    uVar38 = local_11c;
    uVar25 = local_16c;
    local_16c = local_11c;
    goto switchD_003d092a_default;
  }
  if (local_15c == 1) {
    local_15c = 1;
    uVar38 = local_134;
    uVar8 = local_16c;
    local_16c = local_134;
    goto switchD_003d092a_default;
  }
  wVar13 = *(wchar_t *)(local_60 + 4 + (long)(int)local_15c * 8);
LAB_003d0c7d:
  if ((cVar41 == '\x02') && (L'\x02' < wVar13)) {
    wVar40 = wVar13 + L'\xfffffffd';
    if (local_d8[0].cache_avail < wVar40) {
      wVar15 = lzx_br_fillup(strm_00,local_d8);
      if ((wVar15 == L'\0') && (local_d8[0].cache_avail < wVar40)) {
joined_r0x003d157e:
        iVar17 = 0x14;
        if (uVar28 == uVar20) goto LAB_003d1584;
        goto LAB_003d1199;
      }
    }
    iVar17 = local_d8[0].cache_avail - wVar40;
    uVar34 = ((uint)(local_d8[0].cache_buffer >> ((byte)iVar17 & 0x3f)) & cache_masks[(uint)wVar40])
             * 8;
    wVar15 = (int)local_90 + wVar40;
    if (local_d8[0].cache_avail < wVar15) {
      wVar16 = lzx_br_fillup(strm_00,local_d8);
      if ((wVar16 != L'\0') || (wVar15 <= local_d8[0].cache_avail)) {
        iVar17 = local_d8[0].cache_avail - wVar40;
        goto LAB_003d0ef3;
      }
      if (uVar28 != uVar20) {
        iVar17 = 0x14;
        goto LAB_003d1199;
      }
      uVar9 = *(ushort *)
               (*(long *)(piVar37 + 0x36) +
               (ulong)((uint)(local_d8[0].cache_buffer <<
                             ((char)local_90 - (char)(local_d8[0].cache_avail - wVar40) & 0x3fU)) &
                      cache_masks[local_90]) * 2);
      uVar33 = (ulong)uVar9;
      if (piVar37[0x1e] <= (int)(uint)uVar9) {
        uVar33 = 0;
      }
      iVar17 = (local_d8[0].cache_avail - wVar40) - (uint)*(byte *)(local_68 + uVar33);
      local_d8[0].cache_avail = iVar17;
      if (iVar17 < 0) goto LAB_003d1584;
    }
    else {
LAB_003d0ef3:
      uVar9 = *(ushort *)
               (*(long *)(piVar37 + 0x36) +
               (ulong)((uint)(local_d8[0].cache_buffer >> ((char)iVar17 - (char)local_90 & 0x3fU)) &
                      cache_masks[local_90]) * 2);
      uVar33 = (ulong)uVar9;
      if (piVar37[0x1e] <= (int)(uint)uVar9) {
        uVar33 = 0;
      }
      local_d8[0].cache_avail = iVar17 - (uint)*(byte *)(local_68 + uVar33);
    }
    uVar34 = (int)uVar33 + uVar34;
  }
  else {
    if (local_d8[0].cache_avail < wVar13) {
      wVar40 = lzx_br_fillup(strm_00,local_d8);
      if ((wVar40 == L'\0') && (local_d8[0].cache_avail < wVar13)) goto joined_r0x003d157e;
    }
    uVar34 = (uint)(local_d8[0].cache_buffer >> ((byte)(local_d8[0].cache_avail - wVar13) & 0x3f)) &
             cache_masks[wVar13];
    local_d8[0].cache_avail = local_d8[0].cache_avail - wVar13;
  }
  uVar34 = (*(int *)(local_60 + (long)(int)local_15c * 8) + uVar34) - 2;
  local_11c = local_134;
  uVar38 = uVar34;
  local_134 = local_16c;
LAB_003d0f6a:
  local_16c = uVar38;
  uVar34 = uVar36 - uVar34 & uVar4;
LAB_003d0f8e:
  do {
    uVar38 = uVar36;
    if ((int)uVar36 < (int)uVar34) {
      uVar38 = uVar34;
    }
    uVar25 = local_6c - uVar38;
    if ((int)uVar12 < (int)(local_6c - uVar38)) {
      uVar25 = uVar12;
    }
    if (puVar1 <= __dest + (int)uVar25) {
      uVar25 = (int)puVar1 - (int)__dest;
    }
    pvVar19 = (void *)((int)uVar34 + lVar27);
    if ((int)uVar25 < 8) {
      if (0 < (int)uVar25) goto LAB_003d102c;
    }
    else if (((int)(uVar25 + uVar34) < (int)uVar36) || ((int)(uVar25 + uVar36) < (int)uVar34)) {
      memcpy((void *)((int)uVar36 + lVar27),pvVar19,(ulong)uVar25);
      memcpy(__dest,pvVar19,(ulong)uVar25);
    }
    else {
LAB_003d102c:
      uVar33 = 0;
      do {
        uVar2 = *(undefined1 *)((long)pvVar19 + uVar33);
        *(undefined1 *)((int)uVar36 + lVar27 + uVar33) = uVar2;
        __dest[uVar33] = uVar2;
        uVar33 = uVar33 + 1;
      } while (uVar25 != uVar33);
    }
    __dest = __dest + (int)uVar25;
    uVar34 = uVar34 + uVar25 & uVar4;
    uVar36 = uVar36 + uVar25 & uVar4;
    uVar35 = uVar35 - (long)(int)uVar25;
    iVar17 = 0x16;
    if (__dest < puVar1) {
      iVar17 = iVar30;
    }
    iVar26 = 7;
    if (__dest < puVar1) {
      iVar26 = 0;
    }
    uVar8 = uVar25;
    if ((int)uVar12 <= (int)uVar25) {
      iVar17 = iVar30;
      uVar8 = 0;
    }
    uVar38 = 10;
    if ((int)uVar12 <= (int)uVar25) {
      iVar26 = 10;
    }
    uVar12 = uVar12 - uVar8;
    iVar30 = iVar17;
  } while (iVar26 == 0);
  if (iVar26 != 7) {
    if (iVar26 != 10) goto LAB_003d1599;
    iVar17 = 0x12;
    uVar38 = uVar34;
    uVar25 = local_11c;
    uVar8 = local_134;
    goto switchD_003d092a_default;
  }
LAB_003d1199:
  *local_50 = local_d8[0].cache_buffer;
  local_50[1] = local_d8[0]._8_8_;
  *(ulong *)(piVar37 + 0xe) = uVar35;
  piVar37[8] = uVar12;
  piVar37[7] = uVar34;
  piVar37[0x15] = uVar14;
  piVar37[0x17] = wVar13;
  piVar37[0x16] = local_15c;
  piVar37[0x10] = local_16c;
  piVar37[0x11] = local_134;
  piVar37[0x12] = local_11c;
  *piVar37 = iVar17;
  piVar37[6] = uVar36;
  *(long *)((long)pvVar18 + 0x1a8) = (long)puVar1 - (long)__dest;
  uVar38 = 0;
  goto LAB_003d1599;
LAB_003d1584:
  piVar37[0x87] = -0x19;
  uVar38 = 0xffffffe7;
LAB_003d1599:
  lVar27 = local_40 - *(long *)((long)pvVar18 + 0x1a8);
  *(long *)((long)pvVar18 + 0x1a0) = *(long *)((long)pvVar18 + 0x1a0) + lVar27;
  *(long *)((long)pvVar18 + 0x1b0) = *(long *)((long)pvVar18 + 0x1b0) + lVar27;
LAB_003d15c1:
  iVar21 = (uVar28 - *(long *)((long)pvVar18 + 400)) + *(long *)((long)pvVar18 + 0x198);
  *(int64_t *)((long)pvVar18 + 0x198) = iVar21;
  pbVar22 = local_38;
  lVar27 = local_80;
LAB_003d15f3:
  if (1 < uVar38) {
    archive_set_error(&a->archive,-1,"LZX decompression failed (%d)");
    goto LAB_003d1bcf;
  }
  *(int64_t *)(lVar27 + 0x10) = iVar21;
  *(byte **)(lVar27 + 0x38) = pbVar22;
  iVar21 = cab_minimum_consume_cfdata(a,iVar21);
  if (iVar21 < 0) goto LAB_003d1bcf;
  uVar20 = *(ulong *)((long)pvVar18 + 0x1b0);
  uVar10 = *(ushort *)(lVar27 + 8);
  uVar28 = (ulong)uVar10;
  if ((long)uVar28 <= (long)uVar20) goto LAB_003d1666;
  goto LAB_003d0332;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}